

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Value> __thiscall minja::Parser::parseConstant(Parser *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Parser *in_RSI;
  shared_ptr<minja::Value> sVar7;
  string token;
  json number;
  
  pcVar2 = (in_RSI->it)._M_current;
  consumeSpaces(in_RSI,Strip);
  pcVar3 = (in_RSI->it)._M_current;
  if (pcVar3 == (in_RSI->end)._M_current) {
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var6._M_pi = extraout_RDX;
    goto LAB_001aa4cd;
  }
  cVar1 = *pcVar3;
  if ((cVar1 == '\'') || (cVar1 == '\"')) {
    parseString_abi_cxx11_((Parser *)&token);
    if (token._M_dataplus._M_p != (pointer)0x0) {
      std::make_shared<minja::Value,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&token);
      _Var6._M_pi = extraout_RDX_00;
      goto LAB_001aa4cd;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&token);
  }
  if (parseConstant()::prim_tok_abi_cxx11_ == '\0') {
    iVar5 = __cxa_guard_acquire(&parseConstant()::prim_tok_abi_cxx11_);
    if (iVar5 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseConstant()::prim_tok_abi_cxx11_,"true\\b|True\\b|false\\b|False\\b|None\\b",
                 0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseConstant()::prim_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseConstant()::prim_tok_abi_cxx11_);
    }
  }
  consumeToken(&token,in_RSI,&parseConstant()::prim_tok_abi_cxx11_,Strip);
  if (token._M_string_length == 0) {
    parseNumber((Parser *)&number,(CharIterator *)in_RSI,&in_RSI->it);
    if (number.m_data.m_type == null) {
      (in_RSI->it)._M_current = pcVar2;
      (this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      std::
      make_shared<minja::Value,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&>
                ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)this);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json(&number);
  }
  else {
    bVar4 = std::operator==(&token,"true");
    if (!bVar4) {
      bVar4 = std::operator==(&token,"True");
      if (!bVar4) {
        bVar4 = std::operator==(&token,"false");
        if (!bVar4) {
          bVar4 = std::operator==(&token,"False");
          if (!bVar4) {
            bVar4 = std::operator==(&token,"None");
            if (!bVar4) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &number,"Unknown constant token: ",&token);
              std::runtime_error::runtime_error(this_00,(string *)&number);
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            number.m_data.m_type = null;
            number.m_data._1_7_ = 0;
            std::make_shared<minja::Value,decltype(nullptr)>((void **)this);
            goto LAB_001aa4c5;
          }
        }
        number.m_data._0_8_ = number.m_data._0_8_ & 0xffffffffffffff00;
        std::make_shared<minja::Value,bool>((bool *)this);
        goto LAB_001aa4c5;
      }
    }
    number.m_data.m_type = object;
    std::make_shared<minja::Value,bool>((bool *)this);
  }
LAB_001aa4c5:
  std::__cxx11::string::~string((string *)&token);
  _Var6._M_pi = extraout_RDX_01;
LAB_001aa4cd:
  sVar7.super___shared_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  sVar7.super___shared_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<minja::Value>)
         sVar7.super___shared_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value> parseConstant() {
      auto start = it;
      consumeSpaces();
      if (it == end) return nullptr;
      if (*it == '"' || *it == '\'') {
        auto str = parseString();
        if (str) return std::make_shared<Value>(*str);
      }
      static std::regex prim_tok(R"(true\b|True\b|false\b|False\b|None\b)");
      auto token = consumeToken(prim_tok);
      if (!token.empty()) {
        if (token == "true" || token == "True") return std::make_shared<Value>(true);
        if (token == "false" || token == "False") return std::make_shared<Value>(false);
        if (token == "None") return std::make_shared<Value>(nullptr);
        throw std::runtime_error("Unknown constant token: " + token);
      }

      auto number = parseNumber(it, end);
      if (!number.is_null()) return std::make_shared<Value>(number);

      it = start;
      return nullptr;
    }